

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

bool __thiscall
ViconCGStreamIO::VBuffer::
Read<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (VBuffer *this,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *o_rValues)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  uint Key;
  UInt32 Size;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> Value;
  uint local_a0;
  uint local_9c;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_98;
  pair<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_68;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::clear(&o_rValues->_M_t);
  local_9c = 0;
  bVar2 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,&local_9c);
  uVar3 = 0;
  if (bVar2) {
    p_Var1 = &local_98._M_impl.super__Rb_tree_header;
    for (; uVar3 != local_9c; uVar3 = uVar3 + 1) {
      bVar2 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,&local_a0);
      if (!bVar2) {
LAB_00129fb9:
        uVar3 = 0;
        goto LAB_00129fbb;
      }
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      bVar2 = Read<unsigned_int>(this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)&local_98);
      if (!bVar2) {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_98);
        goto LAB_00129fb9;
      }
      local_68.first = local_a0;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree(&local_68.second._M_t,&local_98);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
                  *)o_rValues,&local_68);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_68.second._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_98);
    }
    uVar3 = 1;
  }
LAB_00129fbb:
  return SUB41(uVar3,0);
}

Assistant:

bool Read( std::map< K, V > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    for( ViconCGStreamType::UInt32 Index = 0; Index != Size; ++Index )
    {
      K Key;
      if( !Read( Key ) )
      {
        return false;
      }
      V Value;
      if( !Read( Value ) )
      {
        return false;
      }
      o_rValues.insert( std::make_pair( Key, Value ) );
    }
    return true;
  }